

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsBinarySemaphore.h
# Opt level: O0

void __thiscall HighsBinarySemaphore::release(HighsBinarySemaphore *this)

{
  int iVar1;
  pointer pDVar2;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lg;
  int prev;
  mutex_type *in_stack_ffffffffffffffa8;
  
  pDVar2 = std::
           unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
           ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                         *)0x4be018);
  LOCK();
  iVar1 = (pDVar2->count).super___atomic_base<int>._M_i;
  (pDVar2->count).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  if (iVar1 < 0) {
    std::
    unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
    ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                  *)0x4be0d2);
    std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffa8);
    std::
    unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
    ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                  *)0x4be0ed);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  }
  return;
}

Assistant:

void release() {
    int prev = data_->count.exchange(1, std::memory_order_release);
    if (prev < 0) {
      std::unique_lock<std::mutex> lg{data_->mutex};
      data_->condvar.notify_one();
    }
  }